

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

TestCase * __thiscall testing::UnitTest::GetTestCase(UnitTest *this,int i)

{
  UnitTestImpl *pUVar1;
  pointer piVar2;
  
  if (-1 < i) {
    pUVar1 = this->impl_;
    piVar2 = (pUVar1->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((i < (int)((ulong)((long)(pUVar1->test_case_indices_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) &&
       (-1 < piVar2[(uint)i])) {
      return (pUVar1->test_cases_).
             super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
             super__Vector_impl_data._M_start[(uint)i];
    }
  }
  return (TestCase *)0x0;
}

Assistant:

inline E GetElementOr(const std::vector<E>& v, int i, E default_value) {
  return (i < 0 || i >= static_cast<int>(v.size())) ? default_value : v[i];
}